

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void jacobi_ss_root(double *x,int order,double alpha,double beta,double *dp2,double *p1,double *b,
                   double *c)

{
  int local_64;
  int step_max;
  int step;
  double p2;
  double eps;
  double d;
  double *c_local;
  double *b_local;
  double *p1_local;
  double *dp2_local;
  double beta_local;
  double alpha_local;
  double *pdStack_10;
  int order_local;
  double *x_local;
  
  d = (double)c;
  c_local = b;
  b_local = p1;
  p1_local = dp2;
  dp2_local = (double *)beta;
  beta_local = alpha;
  alpha_local._4_4_ = order;
  pdStack_10 = x;
  p2 = r8_epsilon();
  local_64 = 1;
  while( true ) {
    if (10 < local_64) {
      return;
    }
    jacobi_ss_recur((double *)&step_max,p1_local,b_local,*pdStack_10,alpha_local._4_4_,beta_local,
                    (double)dp2_local,c_local,(double *)d);
    eps = _step_max / *p1_local;
    *pdStack_10 = *pdStack_10 - eps;
    if (ABS(eps) <= p2 * (ABS(*pdStack_10) + 1.0)) break;
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

void jacobi_ss_root ( double *x, int order, double alpha, double beta, 
  double *dp2, double *p1, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SS_ROOT improves an approximate root of a Jacobi polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 May 2006
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input/output, double *X, the approximate root, which
//    should be improved on output.
//
//    Input, int ORDER, the order of the polynomial.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.
//
//    Output, double *DP2, the value of J'(ORDER)(X).
//
//    Output, double *P1, the value of J(ORDER-1)(X).
//
//    Input, double B[ORDER], C[ORDER], the recursion coefficients.
//
{
  double d;
  double eps;
  double p2;
  int step;
  int step_max = 10;

  eps = r8_epsilon ( );

  for ( step = 1; step <= step_max; step++ )
  {
    jacobi_ss_recur ( &p2, dp2, p1, *x, order, alpha, beta, b, c );

    d = p2 / ( *dp2 );
    *x = *x - d;

    if ( fabs ( d ) <= eps * ( fabs ( *x ) + 1.0 ) )
    {
      return;
    }
  }
  return;
}